

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O2

void Vec_MemFreeP(Vec_Mem_t **p)

{
  Vec_Mem_t *__ptr;
  word *__ptr_00;
  int i;
  long lVar1;
  
  __ptr = *p;
  if (__ptr != (Vec_Mem_t *)0x0) {
    for (lVar1 = 0; lVar1 <= __ptr->iPage; lVar1 = lVar1 + 1) {
      __ptr_00 = __ptr->ppPages[lVar1];
      if (__ptr_00 != (word *)0x0) {
        free(__ptr_00);
        __ptr->ppPages[lVar1] = (word *)0x0;
      }
    }
    free(__ptr->ppPages);
    free(__ptr);
    *p = (Vec_Mem_t *)0x0;
  }
  return;
}

Assistant:

static inline void Vec_MemFreeP( Vec_Mem_t ** p )
{
    if ( *p == NULL )
        return;
    Vec_MemFree( *p );
    *p = NULL;
}